

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::SubmitRegistryStringAndCount
          (DnsStats *this,uint32_t registry_id,uint32_t length,uint8_t *value,uint64_t count)

{
  bool local_89;
  undefined1 local_88 [7];
  bool stored;
  DnsHashEntry key;
  uint64_t count_local;
  uint8_t *value_local;
  uint32_t length_local;
  uint32_t registry_id_local;
  DnsStats *this_local;
  
  key.field_6._56_8_ = count;
  DnsHashEntry::DnsHashEntry((DnsHashEntry *)local_88);
  local_89 = false;
  if (length < 0x40) {
    key.hash = key.field_6._56_4_;
    key.registry_id = key.field_6._60_4_;
    key.count._0_4_ = 1;
    key.HashNext._4_4_ = registry_id;
    key.count._4_4_ = length;
    memcpy(&key.key_type,value,(ulong)length);
    *(undefined1 *)((long)&key.key_type + (ulong)length) = 0;
    BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,(DnsHashEntry *)local_88,true,&local_89);
  }
  DnsHashEntry::~DnsHashEntry((DnsHashEntry *)local_88);
  return;
}

Assistant:

void DnsStats::SubmitRegistryStringAndCount(uint32_t registry_id, uint32_t length, uint8_t * value, uint64_t count)
{
    DnsHashEntry key;
    bool stored = false;

    if (length < 64)
    {
        key.count = count;
        key.registry_id = registry_id;
        key.key_length = length;
        key.key_type = 1; /* string */
        memcpy(key.key_value, value, length);
        key.key_value[length] = 0;

        (void)hashTable.InsertOrAdd(&key, true, &stored);
    }
}